

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::divalpha(void *data,int npixels,DataType dt,int nchannels,int alphachan)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  ushort uVar5;
  uint16_t uVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  if (dt < 4) {
    fVar2 = *(float *)(OneValue(Ptex::v2_2::DataType)::one + (ulong)dt * 4);
    switch((ulong)dt) {
    case 0:
      lVar10 = (long)data + (ulong)(alphachan == 0);
      if (npixels * nchannels != 0) {
        lVar7 = npixels * nchannels + lVar10;
        uVar9 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar9 = (ulong)(uint)alphachan;
        }
        do {
          bVar4 = *(byte *)(lVar10 + (int)(-(uint)(alphachan == 0) | alphachan));
          if ((bVar4 != 0) && (0 < (int)uVar9)) {
            uVar11 = 0;
            do {
              *(char *)(lVar10 + uVar11) =
                   (char)(int)((float)*(byte *)(lVar10 + uVar11) * (fVar2 / (float)bVar4));
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          lVar10 = lVar10 + nchannels;
        } while (lVar10 != lVar7);
      }
      break;
    case 1:
      if (npixels * nchannels != 0) {
        pvVar8 = (void *)((long)data + (ulong)(alphachan == 0) * 2);
        pvVar1 = (void *)((long)pvVar8 + (long)(npixels * nchannels) * 2);
        uVar9 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar9 = (ulong)(uint)alphachan;
        }
        do {
          uVar5 = *(ushort *)((long)pvVar8 + (long)(int)(-(uint)(alphachan == 0) | alphachan) * 2);
          if ((uVar5 != 0) && (0 < (int)uVar9)) {
            uVar11 = 0;
            do {
              *(short *)((long)pvVar8 + uVar11 * 2) =
                   (short)(int)((float)*(ushort *)((long)pvVar8 + uVar11 * 2) *
                               (fVar2 / (float)uVar5));
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)nchannels * 2);
        } while (pvVar8 != pvVar1);
      }
      break;
    case 2:
      if (npixels * nchannels != 0) {
        pvVar8 = (void *)((long)data + (ulong)(alphachan == 0) * 2);
        pvVar1 = (void *)((long)pvVar8 + (long)(npixels * nchannels) * 2);
        uVar9 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar9 = (ulong)(uint)alphachan;
        }
        do {
          fVar3 = *(float *)(PtexHalf::h2fTable +
                            (ulong)*(ushort *)
                                    ((long)pvVar8 +
                                    (long)(int)(-(uint)(alphachan == 0) | alphachan) * 2) * 4);
          if (((fVar3 != 0.0) || (NAN(fVar3))) && (0 < (int)uVar9)) {
            uVar11 = 0;
            do {
              uVar6 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                                    (ulong)*(ushort *)((long)pvVar8 + uVar11 * 2) *
                                                    4) * (fVar2 / fVar3));
              *(uint16_t *)((long)pvVar8 + uVar11 * 2) = uVar6;
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)nchannels * 2);
        } while (pvVar8 != pvVar1);
      }
      break;
    case 3:
      if (npixels * nchannels != 0) {
        pvVar8 = (void *)((long)data + (ulong)(alphachan == 0) * 4);
        uVar9 = (ulong)(nchannels - 1);
        if (alphachan != 0) {
          uVar9 = (ulong)(uint)alphachan;
        }
        pvVar1 = (void *)((long)pvVar8 + (long)(npixels * nchannels) * 4);
        do {
          fVar3 = *(float *)((long)pvVar8 + (long)(int)(-(uint)(alphachan == 0) | alphachan) * 4);
          if (((fVar3 != 0.0) || (NAN(fVar3))) && (0 < (int)uVar9)) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar8 + uVar11 * 4) =
                   *(float *)((long)pvVar8 + uVar11 * 4) * (fVar2 / fVar3);
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)nchannels * 4);
        } while (pvVar8 != pvVar1);
      }
    }
  }
  return;
}

Assistant:

void divalpha(void* data, int npixels, DataType dt, int nchannels, int alphachan)
{
    float scale = OneValue(dt);
    switch(dt) {
    case dt_uint8:    divalpha(static_cast<uint8_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_uint16:   divalpha(static_cast<uint16_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_half:     divalpha(static_cast<PtexHalf*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_float:    divalpha(static_cast<float*>(data), npixels, nchannels, alphachan, scale); break;
    }
}